

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::EnumEncoder(SwiftGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  EnumVal *ev;
  SwiftGenerator *pSVar3;
  pointer ppEVar4;
  allocator<char> local_189;
  EnumDef *local_188;
  string local_180;
  SwiftGenerator *local_160;
  IdlNamer *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_188 = enum_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"extension {{ENUM_NAME}}: Encodable {",
             (allocator<char> *)&local_180);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {",
             (allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"var container = encoder.singleValueContainer()",
             (allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"switch self {",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  local_158 = &this->namer_;
  local_160 = this;
  for (ppEVar4 = (local_188->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (local_188->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    ev = *ppEVar4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"KEY",&local_189);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_50,local_158,ev);
    CodeWriter::SetValue(this_00,&local_180,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"RAWKEY",(allocator<char> *)&local_50);
    CodeWriter::SetValue(this_00,&local_180,&ev->name);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"case .{{KEY}}: try container.encode(\"{{RAWKEY}}\")",
               (allocator<char> *)&local_180);
    CodeWriter::operator+=(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"}",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_110);
  pSVar3 = local_160;
  std::__cxx11::string::~string((string *)&local_110);
  iVar2 = (pSVar3->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (pSVar3->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"}",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  iVar2 = (pSVar3->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (pSVar3->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"}",(allocator<char> *)&local_180);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void EnumEncoder(const EnumDef &enum_def) {
    code_ += "extension {{ENUM_NAME}}: Encodable {";
    Indent();
    code_ += "{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {";
    Indent();
    code_ += "var container = encoder.singleValueContainer()";
    code_ += "switch self {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("RAWKEY", ev.name);
      code_ += "case .{{KEY}}: try container.encode(\"{{RAWKEY}}\")";
    }
    code_ += "}";
    Outdent();
    code_ += "}";
    Outdent();
    code_ += "}";
  }